

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::FindLSBCase::compare(FindLSBCase *this,void **inputs,void **outputs)

{
  char cVar1;
  Precision PVar2;
  uint value;
  int iVar3;
  pointer pSVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  ulong uVar9;
  ulong uVar10;
  
  pSVar4 = (this->super_IntegerFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar2 = (pSVar4->varType).m_data.basic.precision;
  uVar5 = glu::getDataTypeScalarSize((pSVar4->varType).m_data.basic.type);
  cVar1 = (&DAT_018a3da0)[(ulong)PVar2 * 4];
  uVar10 = 0;
  uVar9 = 0;
  if (0 < (int)uVar5) {
    uVar9 = (ulong)uVar5;
  }
  do {
    if (uVar9 == uVar10) {
LAB_01277403:
      return (long)(int)uVar5 <= (long)uVar10;
    }
    value = *(uint *)((long)*inputs + uVar10 * 4);
    iVar3 = *(int *)((long)*outputs + uVar10 * 4);
    iVar6 = findLSB(value & (2 << (cVar1 - 1U & 0x1f)) - 1U);
    iVar7 = findLSB(value);
    if ((iVar3 < iVar6) || (iVar7 < iVar3)) {
      poVar8 = std::operator<<(&(this->super_IntegerFunctionCase).m_failMsg.
                                super_basic_ostream<char,_std::char_traits<char>_>,"Expected [");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)uVar10);
      poVar8 = std::operator<<(poVar8,"] in range [");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
      poVar8 = std::operator<<(poVar8,", ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar7);
      std::operator<<(poVar8,"]");
      goto LAB_01277403;
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				integerLength	= getShaderUintBitCount(m_shaderType, precision);
		const deUint32			mask			= getLowBitMask(integerLength);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	value	= ((const deUint32*)inputs[0])[compNdx];
			const int		out		= ((const int*)outputs[0])[compNdx];
			const int		minRef	= findLSB(value&mask);
			const int		maxRef	= findLSB(value);

			if (!de::inRange(out, minRef, maxRef))
			{
				m_failMsg << "Expected [" << compNdx << "] in range [" << minRef << ", " << maxRef << "]";
				return false;
			}
		}

		return true;
	}